

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  string *psVar6;
  pointer ppVar7;
  BuildPreset *pBVar8;
  pointer ppVar9;
  ConfigurePreset *pCVar10;
  uint *puVar11;
  PackageResolveMode *pPVar12;
  bool *pbVar13;
  const_iterator __first;
  const_iterator __last;
  ostream *poVar14;
  pointer pcVar15;
  cmGlobalGenerator *pcVar16;
  pointer pcVar17;
  type pcVar18;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  ostream *local_33a0;
  allocator<char> local_31b1;
  string local_31b0;
  allocator<char> local_3189;
  string local_3188;
  int local_3164;
  ostream *poStack_3160;
  int buildresult;
  ostream *verbose_ostr;
  stringstream ostr;
  ostream oStack_3148;
  allocator<char> local_2fc9;
  string local_2fc8;
  cmValue local_2fa8;
  allocator<char> local_2f99;
  string local_2f98;
  cmValue local_2f78;
  cmValue cachedProjectName;
  string projName;
  undefined1 local_2f38 [8];
  cmMakefile mf_2;
  string local_2170;
  cmValue local_2150;
  cmValue cachedGeneratorToolset;
  undefined1 local_2130 [8];
  cmMakefile mf_1;
  string local_1368;
  cmValue local_1348;
  cmValue cachedGeneratorPlatform;
  undefined1 local_1328 [8];
  cmMakefile mf;
  string local_560;
  cmValue local_540;
  cmValue cachedGeneratorInstance;
  undefined1 local_530 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_520;
  cmValue local_500;
  cmValue cachedGenerator;
  string cachePath;
  undefined1 local_4c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  undefined1 local_4a0 [16];
  const_iterator local_490;
  string local_488;
  optional<cmCMakePresetsGraph::ConfigurePreset> *local_468;
  optional<cmCMakePresetsGraph::ConfigurePreset> *expandedConfigurePreset;
  string local_458;
  char local_431;
  string local_430;
  _Self local_410;
  _Self local_408;
  iterator configurePresetPair;
  string local_3f8;
  string local_3d8;
  optional<cmCMakePresetsGraph::BuildPreset> *local_3b8;
  optional<cmCMakePresetsGraph::BuildPreset> *expandedPreset;
  string local_3a8;
  char local_381;
  string local_380;
  _Self local_360;
  _Self local_358;
  iterator presetPair;
  string local_348;
  string local_328;
  undefined1 local_301;
  undefined1 local_300 [7];
  bool result;
  cmCMakePresetsGraph settingsFile;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  byte local_4a;
  byte local_49;
  bool listPresets_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_48;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nativeOptions_local;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *dir_local;
  cmake *pcStack_20;
  int jobs_local;
  cmake *this_local;
  
  local_49 = verbose;
  local_4a = listPresets;
  pvStack_48 = nativeOptions;
  nativeOptions_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = (string *)targets;
  targets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)dir;
  dir_local._4_4_ = jobs;
  pcStack_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  SetHomeDirectory(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  SetHomeOutputDirectory(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) || ((local_4a & 1) != 0)) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory
              (this,(string *)
                    &settingsFile.Files.
                     super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCMakePresetsGraph::cmCMakePresetsGraph((cmCMakePresetsGraph *)local_300);
    psVar6 = GetHomeDirectory_abi_cxx11_(this);
    local_301 = cmCMakePresetsGraph::ReadProjectPresets
                          ((cmCMakePresetsGraph *)local_300,psVar6,false);
    if ((bool)local_301) {
      if ((local_4a & 1) == 0) {
        local_358._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                     *)&settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,presetName);
        local_360._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                    *)&settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count);
        bVar2 = std::operator==(&local_358,&local_360);
        if (bVar2) {
          psVar6 = GetHomeDirectory_abi_cxx11_(this);
          local_381 = '\"';
          cmStrCat<char_const(&)[25],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                    (&local_380,(char (*) [25])"No such build preset in ",psVar6,
                     (char (*) [4])0x107e0d1,presetName,&local_381);
          cmSystemTools::Error(&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)local_300,(PrintPrecedingNewline *)0x0);
          this_local._4_4_ = 1;
          presetPair._M_node._4_4_ = 1;
        }
        else {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                   ::operator->(&local_358);
          if (((ppVar7->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                     ::operator->(&local_358);
            local_3b8 = &(ppVar7->second).Expanded;
            bVar2 = std::optional::operator_cast_to_bool((optional *)local_3b8);
            if (bVar2) {
              pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_3b8);
              if (((pBVar8->super_Preset).ConditionResult & 1U) == 0) {
                psVar6 = GetHomeDirectory_abi_cxx11_(this);
                configurePresetPair._M_node._7_1_ = 0x22;
                cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                          (&local_3f8,(char (*) [37])"Cannot use disabled build preset in ",psVar6,
                           (char (*) [4])0x107e0d1,presetName,
                           (char *)((long)&configurePresetPair._M_node + 7));
                cmSystemTools::Error(&local_3f8);
                std::__cxx11::string::~string((string *)&local_3f8);
                cmCMakePresetsGraph::PrintBuildPresetList
                          ((cmCMakePresetsGraph *)local_300,(PrintPrecedingNewline *)0x0);
                this_local._4_4_ = 1;
                presetPair._M_node._4_4_ = 1;
              }
              else {
                pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_3b8);
                local_408._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                             *)((long)&settingsFile.parseState.doc.field_2 + 8),
                            &pBVar8->ConfigurePreset);
                local_410._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                            *)((long)&settingsFile.parseState.doc.field_2 + 8));
                bVar2 = std::operator==(&local_408,&local_410);
                if (bVar2) {
                  psVar6 = GetHomeDirectory_abi_cxx11_(this);
                  pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_3b8);
                  local_431 = '\"';
                  cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                            (&local_430,(char (*) [29])"No such configure preset in ",psVar6,
                             (char (*) [4])0x107e0d1,&pBVar8->ConfigurePreset,&local_431);
                  cmSystemTools::Error(&local_430);
                  std::__cxx11::string::~string((string *)&local_430);
                  PrintPresetList(this,(cmCMakePresetsGraph *)local_300);
                  this_local._4_4_ = 1;
                  presetPair._M_node._4_4_ = 1;
                }
                else {
                  ppVar9 = std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                           ::operator->(&local_408);
                  if (((ppVar9->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
                    ppVar9 = std::
                             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                             ::operator->(&local_408);
                    local_468 = &(ppVar9->second).Expanded;
                    bVar2 = std::optional::operator_cast_to_bool((optional *)local_468);
                    if (bVar2) {
                      std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator->(local_468);
                      uVar5 = std::__cxx11::string::empty();
                      if ((uVar5 & 1) == 0) {
                        pCVar10 = std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator->
                                            (local_468);
                        std::__cxx11::string::operator=((string *)dir,(string *)&pCVar10->BinaryDir)
                        ;
                      }
                      pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                         (local_3b8);
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator=(&this->UnprocessedPresetEnvironment,
                                  &(pBVar8->super_Preset).Environment);
                      ProcessPresetEnvironment(this);
                      if ((dir_local._4_4_ == 0) || (dir_local._4_4_ == 0xffffffff)) {
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        bVar2 = std::optional::operator_cast_to_bool((optional *)&pBVar8->Jobs);
                        if (bVar2) {
                          pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_3b8);
                          puVar11 = (uint *)std::optional<int>::operator*(&pBVar8->Jobs);
                          dir_local._4_4_ = *puVar11;
                        }
                      }
                      bVar2 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::empty(targets);
                      if (bVar2) {
                        local_4a0._8_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(targets);
                        __gnu_cxx::
                        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ::__normal_iterator<std::__cxx11::string*>
                                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    *)&local_490,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)(local_4a0 + 8));
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        local_4a0._0_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(&pBVar8->Targets);
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::end(&pBVar8->Targets);
                        local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)std::
                                       vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                       ::
                                       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                                 ((
                                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  *)targets,local_490,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_4a0._0_8_,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_4a8);
                      }
                      uVar5 = std::__cxx11::string::empty();
                      if ((uVar5 & 1) != 0) {
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        std::__cxx11::string::operator=
                                  ((string *)config,(string *)&pBVar8->Configuration);
                      }
                      if ((buildOptions->Clean & 1U) == 0) {
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        bVar2 = std::optional::operator_cast_to_bool
                                          ((optional *)&pBVar8->CleanFirst);
                        if (bVar2) {
                          pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_3b8);
                          pbVar13 = std::optional<bool>::operator*(&pBVar8->CleanFirst);
                          buildOptions->Clean = (bool)(*pbVar13 & 1);
                        }
                      }
                      if (buildOptions->ResolveMode == Default) {
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        bVar2 = std::optional::operator_cast_to_bool
                                          ((optional *)&pBVar8->ResolvePackageReferences);
                        if (bVar2) {
                          pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_3b8);
                          pPVar12 = std::optional<PackageResolveMode>::operator*
                                              (&pBVar8->ResolvePackageReferences);
                          buildOptions->ResolveMode = *pPVar12;
                        }
                      }
                      if ((local_49 & 1) == 0) {
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        bVar2 = std::optional::operator_cast_to_bool((optional *)&pBVar8->Verbose);
                        if (bVar2) {
                          pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_3b8);
                          pbVar13 = std::optional<bool>::operator*(&pBVar8->Verbose);
                          local_49 = *pbVar13 & 1;
                        }
                      }
                      bVar2 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::empty(nativeOptions);
                      if (bVar2) {
                        local_4c0._0_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(nativeOptions);
                        __gnu_cxx::
                        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ::__normal_iterator<std::__cxx11::string*>
                                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    *)(local_4c0 + 8),
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_4c0);
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        __first = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::begin(&pBVar8->NativeToolOptions);
                        pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_3b8);
                        __last = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end(&pBVar8->NativeToolOptions);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)nativeOptions,(const_iterator)local_4c0._8_8_,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )__first._M_current,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )__last._M_current);
                      }
                      presetPair._M_node._4_4_ = 0;
                    }
                    else {
                      pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                         (local_3b8);
                      cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[27]>
                                (&local_488,(char (*) [38])"Could not evaluate configure preset \"",
                                 &pBVar8->ConfigurePreset,
                                 (char (*) [27])"\": Invalid macro expansion");
                      cmSystemTools::Error(&local_488);
                      std::__cxx11::string::~string((string *)&local_488);
                      this_local._4_4_ = 1;
                      presetPair._M_node._4_4_ = 1;
                    }
                  }
                  else {
                    psVar6 = GetHomeDirectory_abi_cxx11_(this);
                    pBVar8 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_3b8);
                    expandedConfigurePreset._7_1_ = 0x22;
                    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                              (&local_458,(char (*) [39])"Cannot use hidden configure preset in ",
                               psVar6,(char (*) [4])0x107e0d1,&pBVar8->ConfigurePreset,
                               (char *)((long)&expandedConfigurePreset + 7));
                    cmSystemTools::Error(&local_458);
                    std::__cxx11::string::~string((string *)&local_458);
                    PrintPresetList(this,(cmCMakePresetsGraph *)local_300);
                    this_local._4_4_ = 1;
                    presetPair._M_node._4_4_ = 1;
                  }
                }
              }
            }
            else {
              cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char_const(&)[27]>
                        (&local_3d8,(char (*) [34])"Could not evaluate build preset \"",presetName,
                         (char (*) [27])"\": Invalid macro expansion");
              cmSystemTools::Error(&local_3d8);
              std::__cxx11::string::~string((string *)&local_3d8);
              cmCMakePresetsGraph::PrintBuildPresetList
                        ((cmCMakePresetsGraph *)local_300,(PrintPrecedingNewline *)0x0);
              this_local._4_4_ = 1;
              presetPair._M_node._4_4_ = 1;
            }
          }
          else {
            psVar6 = GetHomeDirectory_abi_cxx11_(this);
            expandedPreset._7_1_ = 0x22;
            cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                      (&local_3a8,(char (*) [35])"Cannot use hidden build preset in ",psVar6,
                       (char (*) [4])0x107e0d1,presetName,(char *)((long)&expandedPreset + 7));
            cmSystemTools::Error(&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            cmCMakePresetsGraph::PrintBuildPresetList
                      ((cmCMakePresetsGraph *)local_300,(PrintPrecedingNewline *)0x0);
            this_local._4_4_ = 1;
            presetPair._M_node._4_4_ = 1;
          }
        }
      }
      else {
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)local_300,(PrintPrecedingNewline *)0x0);
        this_local._4_4_ = 0;
        presetPair._M_node._4_4_ = 1;
      }
    }
    else {
      psVar6 = GetHomeDirectory_abi_cxx11_(this);
      cmJSONState::GetErrorMessage_abi_cxx11_
                (&local_348,(cmJSONState *)((long)&settingsFile.errors.field_2 + 8),true);
      cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                (&local_328,(char (*) [29])"Could not read presets from ",psVar6,
                 (char (*) [2])0x1074b0c,&local_348);
      cmSystemTools::Error(&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      this_local._4_4_ = 1;
      presetPair._M_node._4_4_ = 1;
    }
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_300);
    if (presetPair._M_node._4_4_ != 0) {
      return this_local._4_4_;
    }
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar14 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar14 = std::operator<<(poVar14,(string *)dir);
    std::operator<<(poVar14," is not a directory\n");
    return 1;
  }
  FindCacheFile((string *)&cachedGenerator,dir);
  bVar2 = LoadCache(this,(string *)&cachedGenerator);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
    goto LAB_004efb81;
  }
  pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"CMAKE_GENERATOR",
             (allocator<char> *)
             ((long)&gen._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
  local_500 = cmState::GetCacheEntryValue(pcVar15,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_500);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
    goto LAB_004efb81;
  }
  psVar6 = cmValue::operator*[abi_cxx11_(&local_500);
  CreateGlobalGenerator((cmake *)local_530,(string *)this,SUB81(psVar6,0));
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_530);
  if (bVar2) {
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &cachedGeneratorInstance,
               (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_530);
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&cachedGeneratorInstance);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &cachedGeneratorInstance);
    pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"CMAKE_GENERATOR_INSTANCE",
               (allocator<char> *)((long)&mf.CurrentImportedTargetScope + 3));
    local_540 = cmState::GetCacheEntryValue(pcVar15,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mf.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_540);
    if (bVar2) {
      pcVar16 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)&cachedGeneratorPlatform,this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_1328,pcVar16,(cmStateSnapshot *)&cachedGeneratorPlatform);
      pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar6 = cmValue::operator*[abi_cxx11_(&local_540);
      uVar3 = (*pcVar17->_vptr_cmGlobalGenerator[8])(pcVar17,psVar6,local_1328);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_1328);
      if (presetPair._M_node._4_4_ != 0) goto LAB_004efb65;
    }
    pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1368,"CMAKE_GENERATOR_PLATFORM",
               (allocator<char> *)((long)&mf_1.CurrentImportedTargetScope + 3));
    local_1348 = cmState::GetCacheEntryValue(pcVar15,&local_1368);
    std::__cxx11::string::~string((string *)&local_1368);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&mf_1.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_1348);
    if (bVar2) {
      pcVar16 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)&cachedGeneratorToolset,this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_2130,pcVar16,(cmStateSnapshot *)&cachedGeneratorToolset);
      pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar6 = cmValue::operator*[abi_cxx11_(&local_1348);
      uVar3 = (*pcVar17->_vptr_cmGlobalGenerator[9])(pcVar17,psVar6,local_2130);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_2130);
      if (presetPair._M_node._4_4_ != 0) goto LAB_004efb65;
    }
    pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2170,"CMAKE_GENERATOR_TOOLSET",
               (allocator<char> *)((long)&mf_2.CurrentImportedTargetScope + 3));
    local_2150 = cmState::GetCacheEntryValue(pcVar15,&local_2170);
    std::__cxx11::string::~string((string *)&local_2170);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&mf_2.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_2150);
    if (bVar2) {
      pcVar16 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)((long)&projName.field_2 + 8),this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_2f38,pcVar16,(cmStateSnapshot *)((long)&projName.field_2 + 8));
      pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar6 = cmValue::operator*[abi_cxx11_(&local_2150);
      uVar3 = (*pcVar17->_vptr_cmGlobalGenerator[10])(pcVar17,psVar6,1,local_2f38);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_2f38);
      if (presetPair._M_node._4_4_ != 0) goto LAB_004efb65;
    }
    std::__cxx11::string::string((string *)&cachedProjectName);
    pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f98,"CMAKE_PROJECT_NAME",&local_2f99);
    local_2f78 = cmState::GetCacheEntryValue(pcVar15,&local_2f98);
    std::__cxx11::string::~string((string *)&local_2f98);
    std::allocator<char>::~allocator(&local_2f99);
    bVar2 = cmValue::operator_cast_to_bool(&local_2f78);
    if (bVar2) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_2f78);
      std::__cxx11::string::operator=((string *)&cachedProjectName,(string *)psVar6);
      pcVar15 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2fc8,"CMAKE_VERBOSE_MAKEFILE",&local_2fc9);
      local_2fa8 = cmState::GetCacheEntryValue(pcVar15,&local_2fc8);
      bVar2 = cmValue::IsOn(&local_2fa8);
      std::__cxx11::string::~string((string *)&local_2fc8);
      std::allocator<char>::~allocator(&local_2fc9);
      if (bVar2) {
        local_49 = 1;
      }
      pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      pcVar18 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator*(&this->State);
      uVar3 = (*pcVar17->_vptr_cmGlobalGenerator[0xb])(pcVar17,pcVar18);
      if ((uVar3 & 1) == 0) {
        this_local._4_4_ = 1;
        presetPair._M_node._4_4_ = 1;
      }
      else {
        pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                  operator->(&this->GlobalGenerator);
        (*pcVar17->_vptr_cmGlobalGenerator[0x16])(pcVar17,&std::cerr,(ulong)dir_local._4_4_);
        std::__cxx11::stringstream::stringstream((stringstream *)&verbose_ostr);
        if ((local_49 & 1) == 0) {
          local_33a0 = &oStack_3148;
        }
        else {
          local_33a0 = (ostream *)&std::cout;
        }
        poStack_3160 = local_33a0;
        pcVar17 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                  operator->(&this->GlobalGenerator);
        uVar3 = dir_local._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3188,"",&local_3189);
        poVar14 = poStack_3160;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_31b0,"",&local_31b1);
        bVar1 = local_49;
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        iVar4 = cmGlobalGenerator::Build
                          (pcVar17,uVar3,&local_3188,dir,(string *)&cachedProjectName,targets,
                           poVar14,&local_31b0,config,buildOptions,(bool)(bVar1 & 1),
                           (cmDuration)timeout.__r,OUTPUT_PASSTHROUGH,nativeOptions);
        std::__cxx11::string::~string((string *)&local_31b0);
        std::allocator<char>::~allocator(&local_31b1);
        std::__cxx11::string::~string((string *)&local_3188);
        std::allocator<char>::~allocator(&local_3189);
        presetPair._M_node._4_4_ = 1;
        local_3164 = iVar4;
        this_local._4_4_ = iVar4;
        std::__cxx11::stringstream::~stringstream((stringstream *)&verbose_ostr);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n");
      this_local._4_4_ = 1;
      presetPair._M_node._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&cachedProjectName);
  }
  else {
    poVar14 = std::operator<<((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"");
    psVar6 = cmValue::operator*[abi_cxx11_(&local_500);
    poVar14 = std::operator<<(poVar14,(string *)psVar6);
    std::operator<<(poVar14,"\"\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
  }
LAB_004efb65:
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_530);
LAB_004efb81:
  std::__cxx11::string::~string((string *)&cachedGenerator);
  return this_local._4_4_;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != true) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ":",
                 settingsFile.parseState.GetErrorMessage()));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE").IsOn()) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  std::stringstream ostr;
  // `cmGlobalGenerator::Build` logs metadata about what directory and commands
  // are being executed to the `output` parameter. If CMake is verbose, print
  // this out.
  std::ostream& verbose_ostr = verbose ? std::cout : ostr;
  int buildresult = this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, verbose_ostr, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);

  return buildresult;
}